

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.cpp
# Opt level: O2

void duckdb::Node256::DeleteChild(ART *art,Node *node,uint8_t byte)

{
  ushort uVar1;
  Node256 *pNVar2;
  undefined7 in_register_00000011;
  Node node256;
  
  pNVar2 = Node::Ref<duckdb::Node256>(art,(Node)(node->super_IndexPointer).data,NODE_256);
  Node::Free(art,pNVar2->children + (CONCAT71(in_register_00000011,byte) & 0xffffffff));
  uVar1 = (short)*(undefined4 *)pNVar2 - 1;
  pNVar2->count = uVar1;
  if (uVar1 < 0x25) {
    node256 = (Node)(node->super_IndexPointer).data;
    Node48::ShrinkNode256(art,node,&node256);
  }
  return;
}

Assistant:

void Node256::DeleteChild(ART &art, Node &node, const uint8_t byte) {
	auto &n256 = Node::Ref<Node256>(art, node, NODE_256);

	// Free the child and decrease the count.
	Node::Free(art, n256.children[byte]);
	n256.count--;

	// Shrink to Node48.
	if (n256.count <= SHRINK_THRESHOLD) {
		auto node256 = node;
		Node48::ShrinkNode256(art, node, node256);
	}
}